

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int send_new_connection_id
              (quicly_conn_t *conn,quicly_send_context_t *s,st_quicly_local_cid_t *new_cid)

{
  quicly_sent_t *pqVar1;
  uint8_t *in_RDX;
  quicly_sent_t **in_RSI;
  quicly_sent_acked_cb in_RDI;
  uint64_t retire_prior_to;
  quicly_sent_t *sent;
  int ret;
  quicly_sent_acked_cb acked;
  quicly_sent_t **sent_00;
  uint8_t *cid;
  undefined7 in_stack_ffffffffffffffd0;
  uint8_t in_stack_ffffffffffffffd7;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  cid = (uint8_t *)0x0;
  acked = in_RDI;
  sent_00 = in_RSI;
  quicly_new_connection_id_frame_capacity
            ((uint64_t)in_RDX,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             in_stack_ffffffffffffffd7);
  local_4 = allocate_ack_eliciting_frame
                      ((quicly_conn_t *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (quicly_send_context_t *)
                       CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),(size_t)cid,
                       sent_00,acked);
  if (local_4 == 0) {
    *(undefined8 *)(CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0) + 8) =
         *(undefined8 *)(in_RDX + 8);
    pqVar1 = (quicly_sent_t *)
             quicly_encode_new_connection_id_frame
                       (in_RDX,(ulong)in_stack_ffffffffffffffd8,
                        CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),cid,
                        (uint8_t)((ulong)sent_00 >> 0x38),(uint8_t *)acked);
    in_RSI[0xb] = pqVar1;
    *(long *)(in_RDI + 0x400) = *(long *)(in_RDI + 0x400) + 1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int send_new_connection_id(quicly_conn_t *conn, quicly_send_context_t *s, struct st_quicly_local_cid_t *new_cid)
{
    int ret;
    quicly_sent_t *sent;
    uint64_t retire_prior_to = 0; /* TODO */

    ret = allocate_ack_eliciting_frame(
        conn, s, quicly_new_connection_id_frame_capacity(new_cid->sequence, retire_prior_to, new_cid->cid.len), &sent,
        on_ack_new_connection_id);
    if (ret != 0)
        return ret;
    sent->data.new_connection_id.sequence = new_cid->sequence;

    s->dst = quicly_encode_new_connection_id_frame(s->dst, new_cid->sequence, retire_prior_to, new_cid->cid.cid, new_cid->cid.len,
                                                   new_cid->stateless_reset_token);

    ++conn->super.stats.num_frames_sent.new_connection_id;
    QUICLY_PROBE(NEW_CONNECTION_ID_SEND, conn, conn->stash.now, new_cid->sequence, retire_prior_to,
                 QUICLY_PROBE_HEXDUMP(new_cid->cid.cid, new_cid->cid.len),
                 QUICLY_PROBE_HEXDUMP(new_cid->stateless_reset_token, QUICLY_STATELESS_RESET_TOKEN_LEN));

    return 0;
}